

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

void __thiscall r_comp::Decompiler::write_fact(Decompiler *this,uint16_t read_index)

{
  char local_14 [2];
  uint16_t local_12;
  Decompiler *pDStack_10;
  uint16_t read_index_local;
  Decompiler *this_local;
  
  if ((this->in_hlp & 1U) != 0) {
    this->horizontal_set = true;
  }
  local_12 = read_index;
  pDStack_10 = this;
  if ((this->closing_set & 1U) != 0) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  local_14[1] = 0x28;
  OutStream::push<char>(this->out_stream,local_14 + 1,local_12);
  write_expression_head(this,local_12);
  write_expression_tail(this,local_12,true,false);
  if ((this->closing_set & 1U) != 0) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  local_14[0] = ')';
  OutStream::operator<<(this->out_stream,local_14);
  this->horizontal_set = false;
  return;
}

Assistant:

void Decompiler::write_fact(uint16_t read_index)
{
    if (in_hlp) {
        horizontal_set = true;
    }

    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    out_stream->push('(', read_index);
    write_expression_head(read_index);
    write_expression_tail(read_index, true);

    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    *out_stream << ')';
    horizontal_set = false;
}